

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O1

void __thiscall QAbstractItemModel::endMoveRows(QAbstractItemModel *this)

{
  qsizetype *pqVar1;
  bool bVar2;
  bool bVar3;
  int destinationChild;
  QAbstractItemModelPrivate *this_00;
  iterator iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QModelIndex local_108;
  QModelIndex local_e8;
  QModelIndex local_c8;
  QModelIndex local_a8;
  int local_88;
  int local_84;
  int local_80;
  undefined1 local_79;
  void *local_78;
  QModelIndex *pQStack_70;
  int *local_68;
  int *piStack_60;
  QModelIndex *local_58;
  int *piStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemModelPrivate **)(this + 8);
  iVar4 = QList<QAbstractItemModelPrivate::Change>::end
                    (&(this_00->changes).super_QList<QAbstractItemModelPrivate::Change>);
  local_a8.r = iVar4.i[-1].parent.r;
  local_a8.c = iVar4.i[-1].parent.c;
  local_a8.i = iVar4.i[-1].parent.i;
  local_a8.m.ptr = iVar4.i[-1].parent.m.ptr;
  destinationChild = iVar4.i[-1].first;
  bVar2 = iVar4.i[-1].needsAdjust;
  pqVar1 = &(this_00->changes).super_QList<QAbstractItemModelPrivate::Change>.d.size;
  *pqVar1 = *pqVar1 + -1;
  iVar4 = QList<QAbstractItemModelPrivate::Change>::end
                    (&(this_00->changes).super_QList<QAbstractItemModelPrivate::Change>);
  local_c8.r = iVar4.i[-1].parent.r;
  local_c8.c = iVar4.i[-1].parent.c;
  local_e8.i = iVar4.i[-1].parent.i;
  local_c8.m.ptr = iVar4.i[-1].parent.m.ptr;
  local_80 = iVar4.i[-1].first;
  local_84 = iVar4.i[-1].last;
  bVar3 = iVar4.i[-1].needsAdjust;
  pqVar1 = &(this_00->changes).super_QList<QAbstractItemModelPrivate::Change>.d.size;
  *pqVar1 = *pqVar1 + -1;
  local_108.m.ptr = local_a8.m.ptr;
  iVar5 = (local_84 - local_80) + 1;
  local_108.r = local_a8.r;
  local_108.c = local_a8.c;
  local_108.i = local_a8.i;
  if ((bVar2 & 1U) != 0) {
    local_108.r = local_a8.r;
    local_108.c = local_a8.c;
    local_108.r = local_108.r - iVar5;
    local_108.m.ptr = (QAbstractItemModel *)this;
  }
  local_e8._0_8_ = local_c8._0_8_;
  local_e8.m.ptr = local_c8.m.ptr;
  if ((bVar3 & 1U) != 0) {
    local_e8.c = local_c8.c;
    local_e8.r = local_c8.r + iVar5;
    local_e8.m.ptr = (QAbstractItemModel *)this;
  }
  local_c8.i = local_e8.i;
  QAbstractItemModelPrivate::itemsMoved
            (this_00,&local_e8,local_80,local_84,&local_108,destinationChild,Vertical);
  local_68 = &local_80;
  piStack_60 = &local_84;
  piStack_50 = &local_88;
  local_78 = (void *)0x0;
  local_48 = &local_79;
  local_88 = destinationChild;
  pQStack_70 = &local_e8;
  local_58 = &local_108;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0x14,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::endMoveRows()
{
    Q_D(QAbstractItemModel);

    QAbstractItemModelPrivate::Change insertChange = d->changes.pop();
    QAbstractItemModelPrivate::Change removeChange = d->changes.pop();

    QModelIndex adjustedSource = removeChange.parent;
    QModelIndex adjustedDestination = insertChange.parent;

    const int numMoved = removeChange.last - removeChange.first + 1;
    if (insertChange.needsAdjust)
      adjustedDestination = createIndex(adjustedDestination.row() - numMoved, adjustedDestination.column(), adjustedDestination.internalPointer());

    if (removeChange.needsAdjust)
      adjustedSource = createIndex(adjustedSource.row() + numMoved, adjustedSource.column(), adjustedSource.internalPointer());

    d->itemsMoved(adjustedSource, removeChange.first, removeChange.last, adjustedDestination, insertChange.first, Qt::Vertical);

    emit rowsMoved(adjustedSource, removeChange.first, removeChange.last, adjustedDestination, insertChange.first, QPrivateSignal());
}